

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O0

int tchecker::ta::lexical_cmp(transition_t *t1,transition_t *t2)

{
  clock_constraint_container_t *pcVar1;
  clock_constraint_container_t *pcVar2;
  clock_reset_container_t *c1;
  clock_reset_container_t *c2;
  int reset_cmp;
  int guard_cmp;
  int src_invariant_cmp;
  int syncprod_cmp;
  transition_t *t2_local;
  transition_t *t1_local;
  
  t1_local._4_4_ = syncprod::lexical_cmp(&t1->super_transition_t,&t2->super_transition_t);
  if (t1_local._4_4_ == 0) {
    pcVar1 = transition_t::src_invariant_container(t1);
    pcVar2 = transition_t::src_invariant_container(t2);
    t1_local._4_4_ = tchecker::lexical_cmp(pcVar1,pcVar2);
    if (t1_local._4_4_ == 0) {
      pcVar1 = transition_t::guard_container(t1);
      pcVar2 = transition_t::guard_container(t2);
      t1_local._4_4_ = tchecker::lexical_cmp(pcVar1,pcVar2);
      if (t1_local._4_4_ == 0) {
        c1 = transition_t::reset_container(t1);
        c2 = transition_t::reset_container(t2);
        t1_local._4_4_ = tchecker::lexical_cmp(c1,c2);
        if (t1_local._4_4_ == 0) {
          pcVar1 = transition_t::tgt_invariant_container(t1);
          pcVar2 = transition_t::tgt_invariant_container(t2);
          t1_local._4_4_ = tchecker::lexical_cmp(pcVar1,pcVar2);
        }
      }
    }
  }
  return t1_local._4_4_;
}

Assistant:

int lexical_cmp(tchecker::ta::transition_t const & t1, tchecker::ta::transition_t const & t2)
{
  int syncprod_cmp = tchecker::syncprod::lexical_cmp(t1, t2);
  if (syncprod_cmp != 0)
    return syncprod_cmp;
  int src_invariant_cmp = tchecker::lexical_cmp(t1.src_invariant_container(), t2.src_invariant_container());
  if (src_invariant_cmp != 0)
    return src_invariant_cmp;
  int guard_cmp = tchecker::lexical_cmp(t1.guard_container(), t2.guard_container());
  if (guard_cmp != 0)
    return guard_cmp;
  int reset_cmp = tchecker::lexical_cmp(t1.reset_container(), t2.reset_container());
  if (reset_cmp != 0)
    return reset_cmp;
  return tchecker::lexical_cmp(t1.tgt_invariant_container(), t2.tgt_invariant_container());
}